

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

int ssl_cert_add1_chain_cert(CERT *cert,X509 *x509)

{
  bool bVar1;
  pointer this;
  byte local_49;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_30;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_28;
  UniquePtr<CRYPTO_BUFFER> buffer;
  X509 *x509_local;
  CERT *cert_local;
  
  buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)x509;
  if (cert->x509_method != (SSL_X509_METHOD *)0x0) {
    bssl::x509_to_buffer((bssl *)&local_28,x509);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
    local_49 = 1;
    if (bVar1) {
      this = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                       (&cert->legacy_credential);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::unique_ptr(&local_30,&local_28);
      bVar1 = ssl_credential_st::AppendIntermediateCert(this,&local_30);
      local_49 = bVar1 ^ 0xff;
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
    }
    bVar1 = (local_49 & 1) == 0;
    if (bVar1) {
      bssl::ssl_crypto_x509_cert_flush_cached_chain(cert);
    }
    cert_local._4_4_ = (uint)bVar1;
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
    return cert_local._4_4_;
  }
  __assert_fail("cert->x509_method",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                ,0x27d,"int ssl_cert_add1_chain_cert(CERT *, X509 *)");
}

Assistant:

static int ssl_cert_add1_chain_cert(CERT *cert, X509 *x509) {
  assert(cert->x509_method);

  UniquePtr<CRYPTO_BUFFER> buffer = x509_to_buffer(x509);
  if (!buffer ||
      !cert->legacy_credential->AppendIntermediateCert(std::move(buffer))) {
    return 0;
  }

  ssl_crypto_x509_cert_flush_cached_chain(cert);
  return 1;
}